

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O2

void __thiscall cmCTestBuildCommand::cmCTestBuildCommand(cmCTestBuildCommand *this)

{
  cmCTestHandlerCommand::cmCTestHandlerCommand(&this->super_cmCTestHandlerCommand);
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestBuildCommand_005e1f20;
  this->GlobalGenerator = (cmGlobalGenerator *)0x0;
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[7] = "NUMBER_ERRORS";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[8] = "NUMBER_WARNINGS";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[9] = "TARGET";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[10] = "CONFIGURATION";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0xb] = "FLAGS";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0xc] = "PROJECT_NAME";
  (this->super_cmCTestHandlerCommand).Arguments.
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[0xd] = (char *)0x0;
  (this->super_cmCTestHandlerCommand).Last = 0xd;
  return;
}

Assistant:

cmCTestBuildCommand::cmCTestBuildCommand()
{
  this->GlobalGenerator = nullptr;
  this->Arguments[ctb_NUMBER_ERRORS] = "NUMBER_ERRORS";
  this->Arguments[ctb_NUMBER_WARNINGS] = "NUMBER_WARNINGS";
  this->Arguments[ctb_TARGET] = "TARGET";
  this->Arguments[ctb_CONFIGURATION] = "CONFIGURATION";
  this->Arguments[ctb_FLAGS] = "FLAGS";
  this->Arguments[ctb_PROJECT_NAME] = "PROJECT_NAME";
  this->Arguments[ctb_LAST] = nullptr;
  this->Last = ctb_LAST;
}